

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

unsigned_long __thiscall tetgenmesh::randomnation(tetgenmesh *this,uint choices)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  
  if (0xae528 < choices) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->randomseed * 0x556 + 0x24d69;
    uVar2 = (ulong)(SUB164(auVar1 % ZEXT816(0xae529),0) * 0x556 + 0x24d69) % 0xae529;
    this->randomseed = uVar2;
    uVar2 = ((ulong)choices / 0xae529) * SUB168(auVar1 % ZEXT816(0xae529),0) + uVar2;
    uVar3 = (ulong)choices;
    if (uVar2 < choices) {
      uVar3 = 0;
    }
    return uVar2 - uVar3;
  }
  uVar2 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
  this->randomseed = uVar2;
  return uVar2 % (ulong)choices;
}

Assistant:

unsigned long tetgenmesh::randomnation(unsigned int choices)
{
  unsigned long newrandom;

  if (choices >= 714025l) {
    newrandom = (randomseed * 1366l + 150889l) % 714025l;
    randomseed = (newrandom * 1366l + 150889l) % 714025l;
    newrandom = newrandom * (choices / 714025l) + randomseed;
    if (newrandom >= choices) {
      return newrandom - choices;
    } else {
      return newrandom;
    }
  } else {
    randomseed = (randomseed * 1366l + 150889l) % 714025l;
    return randomseed % choices;
  }
}